

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Program::~Program(Program *this)

{
  (*this->m_gl->deleteProgram)(this->m_program);
  std::__cxx11::string::~string((string *)&this->m_info);
  return;
}

Assistant:

Program::~Program (void)
{
	m_gl.deleteProgram(m_program);
}